

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_update_local_settings
              (nghttp2_session *session,nghttp2_settings_entry *iv,size_t niv)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint8_t header_table_size_seen;
  uint32_t min_header_table_size;
  uint32_t header_table_size;
  int32_t new_initial_window_size;
  size_t i;
  int rv;
  nghttp2_hd_inflater *in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint3 in_stack_ffffffffffffffc0;
  uint uVar1;
  uint32_t a;
  uint local_38;
  int local_34;
  ulong local_30;
  int local_4;
  
  local_34 = -1;
  local_38 = 0;
  a = 0xffffffff;
  uVar1 = (uint)in_stack_ffffffffffffffc0;
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    in_stack_ffffffffffffffbc = *(int *)(in_RSI + local_30 * 8);
    if (in_stack_ffffffffffffffbc == 1) {
      uVar1 = CONCAT13(1,(int3)uVar1);
      local_38 = *(uint *)(in_RSI + 4 + local_30 * 8);
      a = nghttp2_min_uint32(a,*(uint32_t *)(in_RSI + 4 + local_30 * 8));
    }
    else if (in_stack_ffffffffffffffbc == 4) {
      local_34 = *(int *)(in_RSI + 4 + local_30 * 8);
    }
  }
  if ((((char)(uVar1 >> 0x18) == '\0') ||
      (((local_38 <= a ||
        (local_4 = nghttp2_hd_inflate_change_table_size(in_stack_ffffffffffffffa8,0x1124db),
        local_4 == 0)) &&
       (local_4 = nghttp2_hd_inflate_change_table_size(in_stack_ffffffffffffffa8,0x11250c),
       local_4 == 0)))) &&
     ((local_34 == -1 ||
      (local_4 = session_update_local_initial_window_size
                           ((nghttp2_session *)CONCAT44(a,uVar1),in_stack_ffffffffffffffbc,
                            in_stack_ffffffffffffffb8), local_4 == 0)))) {
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      switch(*(undefined4 *)(in_RSI + local_30 * 8)) {
      case 1:
        *(undefined4 *)(in_RDI + 0xb44) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        break;
      case 2:
        *(undefined4 *)(in_RDI + 0xb48) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        break;
      case 3:
        *(undefined4 *)(in_RDI + 0xb4c) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        break;
      case 4:
        *(undefined4 *)(in_RDI + 0xb50) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        break;
      case 5:
        *(undefined4 *)(in_RDI + 0xb54) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        break;
      case 6:
        *(undefined4 *)(in_RDI + 0xb58) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        break;
      case 8:
        *(undefined4 *)(in_RDI + 0xb5c) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        break;
      case 9:
        *(undefined4 *)(in_RDI + 0xb60) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp2_session_update_local_settings(nghttp2_session *session,
                                          nghttp2_settings_entry *iv,
                                          size_t niv) {
  int rv;
  size_t i;
  int32_t new_initial_window_size = -1;
  uint32_t header_table_size = 0;
  uint32_t min_header_table_size = UINT32_MAX;
  uint8_t header_table_size_seen = 0;
  /* For NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE, use the value last
     seen.  For NGHTTP2_SETTINGS_HEADER_TABLE_SIZE, use both minimum
     value and last seen value. */
  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      header_table_size_seen = 1;
      header_table_size = iv[i].value;
      min_header_table_size =
        nghttp2_min_uint32(min_header_table_size, iv[i].value);
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      new_initial_window_size = (int32_t)iv[i].value;
      break;
    }
  }
  if (header_table_size_seen) {
    if (min_header_table_size < header_table_size) {
      rv = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,
                                                min_header_table_size);
      if (rv != 0) {
        return rv;
      }
    }

    rv = nghttp2_hd_inflate_change_table_size(&session->hd_inflater,
                                              header_table_size);
    if (rv != 0) {
      return rv;
    }
  }
  if (new_initial_window_size != -1) {
    rv = session_update_local_initial_window_size(
      session, new_initial_window_size,
      (int32_t)session->local_settings.initial_window_size);
    if (rv != 0) {
      return rv;
    }
  }

  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      session->local_settings.header_table_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:
      session->local_settings.enable_push = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
      session->local_settings.max_concurrent_streams = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      session->local_settings.initial_window_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
      session->local_settings.max_frame_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
      session->local_settings.max_header_list_size = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
      session->local_settings.enable_connect_protocol = iv[i].value;
      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
      session->local_settings.no_rfc7540_priorities = iv[i].value;
      break;
    }
  }

  return 0;
}